

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  char *pcVar2;
  stringpiece_ssize_type sVar3;
  iterator iVar4;
  ostream *poVar5;
  ulong uVar6;
  mapped_type *this_02;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  int iVar10;
  size_type pos;
  StringPiece x;
  StringPiece proto_file_list;
  StringPiece proto_file;
  StringPiece framework_name;
  key_type local_d0;
  key_type local_b0;
  StringPiece local_90;
  char local_80;
  undefined7 uStack_7f;
  StringPiece local_70;
  ulong local_60;
  StringPiece local_58;
  ulong local_48 [2];
  ulong local_38;
  
  sVar3 = StringPiece::find(line,':',0);
  local_38 = (ulong)(int)sVar3;
  local_60 = 0xffffffffffffffff;
  if (local_38 != 0xffffffffffffffff) {
    iVar10 = 0;
    StringPiece::StringPiece(&local_58,*line,0,local_38);
    StringPiece::StringPiece
              (&local_90,*line,(sVar3 << 0x20) + 0x100000000 >> 0x20,~local_38 + line->length_);
    StringPieceTrimWhitespace(&local_58);
    if (0 < local_90.length_) {
      paVar1 = &local_d0.field_2;
      pos = 0;
      do {
        sVar3 = StringPiece::find(&local_90,',',pos);
        if ((long)(int)sVar3 == local_60) {
          sVar3 = local_90.length_;
        }
        x.length_ = local_90.length_;
        x.ptr_ = local_90.ptr_;
        StringPiece::StringPiece(&local_70,x,pos,(long)((int)sVar3 - iVar10));
        StringPieceTrimWhitespace(&local_70);
        if (local_70.length_ != 0) {
          this_00 = &this->map_->_M_t;
          local_d0._M_dataplus._M_p = (pointer)paVar1;
          if (local_70.ptr_ == (char *)0x0) {
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,local_70.ptr_,local_70.ptr_ + local_70.length_);
          }
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(this_00,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)iVar4._M_node != &(this->map_->_M_t)._M_impl.super__Rb_tree_header)
          {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: duplicate proto file reference, replacing framework entry for \'",
                       0x48);
            if (local_70.ptr_ == (char *)0x0) {
              local_d0._M_string_length = 0;
              local_d0.field_2._M_allocated_capacity =
                   local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_d0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,local_70.ptr_,local_70.ptr_ + local_70.length_);
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                                local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' with \'",8);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            if (local_58.ptr_ == (char *)0x0) {
              local_b0._M_string_length = 0;
              local_b0.field_2._M_allocated_capacity =
                   local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b0,local_58.ptr_,local_58.ptr_ + local_58.length_);
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' (was \'",8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,*(char **)(iVar4._M_node + 2),
                                (long)iVar4._M_node[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\').",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar1) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            std::ostream::flush();
          }
          uVar6 = StringPiece::find(&local_70,' ',0);
          if (uVar6 != local_60) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                       ,0x66);
            if (local_70.ptr_ == (char *)0x0) {
              local_d0._M_string_length = 0;
              local_d0.field_2._M_allocated_capacity =
                   local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_d0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,local_70.ptr_,local_70.ptr_ + local_70.length_);
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                                local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar1) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            std::ostream::flush();
          }
          if (local_58.ptr_ == (char *)0x0) {
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_d0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_d0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,local_58.ptr_,local_58.ptr_ + local_58.length_);
          }
          this_01 = this->map_;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          if (local_70.ptr_ == (char *)0x0) {
            local_b0._M_string_length = 0;
            local_b0.field_2._M_allocated_capacity =
                 local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,local_70.ptr_,local_70.ptr_ + local_70.length_);
          }
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_01,&local_b0);
          std::__cxx11::string::operator=((string *)this_02,(string *)&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        iVar10 = (int)sVar3 + 1;
        pos = (size_type)iVar10;
      } while ((long)pos < local_90.length_);
    }
    goto LAB_00236622;
  }
  local_58.ptr_ = (char *)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Framework/proto file mapping line without colon sign: \'","");
  pcVar2 = line->ptr_;
  local_90.ptr_ = &local_80;
  if (pcVar2 == (char *)0x0) {
    local_90.length_ = 0;
    local_80 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar2,pcVar2 + line->length_);
  }
  uVar6 = 0xf;
  if ((ulong *)local_58.ptr_ != local_48) {
    uVar6 = local_48[0];
  }
  if (uVar6 < (ulong)(local_90.length_ + local_58.length_)) {
    uVar6 = 0xf;
    if (local_90.ptr_ != &local_80) {
      uVar6 = CONCAT71(uStack_7f,local_80);
    }
    if (uVar6 < (ulong)(local_90.length_ + local_58.length_)) goto LAB_002364ef;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_58.ptr_);
  }
  else {
LAB_002364ef:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_90.ptr_);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0.field_2._8_8_ = plVar8[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90.ptr_ != &local_80) {
    operator_delete(local_90.ptr_,CONCAT71(uStack_7f,local_80) + 1);
  }
  if ((ulong *)local_58.ptr_ != local_48) {
    operator_delete(local_58.ptr_,local_48[0] + 1);
  }
LAB_00236622:
  return local_38 != local_60;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Framework/proto file mapping line without colon sign: '") +
        line.ToString() + "'.";
    return false;
  }
  StringPiece framework_name(line, 0, offset);
  StringPiece proto_file_list(line, offset + 1, line.length() - offset - 1);
  StringPieceTrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file(proto_file_list, start, offset - start);
    StringPieceTrimWhitespace(&proto_file);
    if (proto_file.size() != 0) {
      map<string, string>::iterator existing_entry =
          map_->find(proto_file.ToString());
      if (existing_entry != map_->end()) {
        cerr << "warning: duplicate proto file reference, replacing framework entry for '"
             << proto_file.ToString() << "' with '" << framework_name.ToString()
             << "' (was '" << existing_entry->second << "')." << endl;
        cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        cerr << "note: framework mapping file had a proto file with a space in, hopefully that isn't a missing comma: '"
             << proto_file.ToString() << "'" << endl;
        cerr.flush();
      }

      (*map_)[proto_file.ToString()] = framework_name.ToString();
    }

    start = offset + 1;
  }

  return true;
}